

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncTimeCoordinator.cpp
# Opt level: O0

string * __thiscall
helics::AsyncTimeCoordinator::printTimeStatus_abi_cxx11_(AsyncTimeCoordinator *this)

{
  string *in_RDI;
  undefined1 in_stack_00000180 [16];
  undefined1 in_stack_00000190 [16];
  double local_c8;
  double local_c0;
  char *local_b8;
  undefined8 local_b0;
  double local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  double *local_70;
  char *local_68;
  undefined8 local_60;
  double *local_58;
  double *local_50;
  char *local_48;
  undefined8 local_40;
  undefined1 *local_28;
  double local_20;
  double *local_18;
  double *local_10;
  undefined8 *local_8;
  
  local_b8 = "{{\"time_next\":{}, \"Te\":{}}}";
  local_b0 = 0x1b;
  local_c0 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x5617e6);
  local_c8 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x5617fa);
  local_48 = local_b8;
  local_40 = local_b0;
  local_50 = &local_c0;
  local_58 = &local_c8;
  local_68 = local_b8;
  local_60 = local_b0;
  local_20 = local_c0;
  local_18 = local_98;
  local_98[0] = local_c0;
  local_28 = local_88;
  local_8 = &local_78;
  local_10 = local_98;
  local_78 = 0xaa;
  local_70 = local_10;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000190,(format_args)in_stack_00000180);
  return in_RDI;
}

Assistant:

std::string AsyncTimeCoordinator::printTimeStatus() const
{
    return fmt::format(R"raw({{"time_next":{}, "Te":{}}})raw",
                       static_cast<double>(currentMinTime),
                       static_cast<double>(nextEvent));
}